

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXExportProperty::DumpBinary(FBXExportProperty *this,StreamWriterLE *s)

{
  char cVar1;
  double *pdVar2;
  pointer puVar3;
  ostream *poVar4;
  DeadlyImportError *this_00;
  size_t i_1;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  string sStack_1c8;
  ostringstream err;
  
  StreamWriter<false,_false>::Put<unsigned_char>(s,this->type);
  pdVar2 = (double *)
           (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar1 = this->type;
  switch(cVar1) {
  case 'C':
    StreamWriter<false,_false>::Put<unsigned_char>(s,*(uchar *)pdVar2);
    return;
  case 'D':
    StreamWriter<false,_false>::Put<double>(s,*pdVar2);
    return;
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
    goto switchD_0035793e_caseD_45;
  case 'F':
    StreamWriter<false,_false>::Put<float>(s,*(float *)pdVar2);
    return;
  case 'I':
    StreamWriter<false,_false>::Put<int>(s,(int)*(float *)pdVar2);
    return;
  case 'L':
    StreamWriter<false,_false>::Put<long>(s,(long)*pdVar2);
    return;
  case 'R':
  case 'S':
    StreamWriter<false,_false>::Put<unsigned_int>
              (s,*(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (int)pdVar2);
    for (uVar5 = 0;
        puVar3 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
        uVar5 = uVar5 + 1) {
      StreamWriter<false,_false>::Put<unsigned_char>(s,puVar3[uVar5]);
    }
    return;
  }
  switch(cVar1) {
  case 'd':
    uVar6 = (ulong)((long)(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar2) >> 3;
    StreamWriter<false,_false>::Put<unsigned_int>(s,(uint)uVar6);
    StreamWriter<false,_false>::Put<unsigned_int>(s,0);
    StreamWriter<false,_false>::Put<unsigned_int>
              (s,*(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      StreamWriter<false,_false>::Put<double>(s,pdVar2[uVar5]);
    }
    break;
  case 'f':
    uVar6 = (ulong)((long)(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar2) >> 2;
    StreamWriter<false,_false>::Put<unsigned_int>(s,(uint)uVar6);
    StreamWriter<false,_false>::Put<unsigned_int>(s,0);
    StreamWriter<false,_false>::Put<unsigned_int>
              (s,*(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      StreamWriter<false,_false>::Put<float>(s,*(float *)((long)pdVar2 + uVar5 * 4));
    }
    break;
  case 'i':
    uVar6 = (ulong)((long)(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar2) >> 2;
    StreamWriter<false,_false>::Put<unsigned_int>(s,(uint)uVar6);
    StreamWriter<false,_false>::Put<unsigned_int>(s,0);
    StreamWriter<false,_false>::Put<unsigned_int>
              (s,*(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      StreamWriter<false,_false>::Put<int>(s,(int)*(float *)((long)pdVar2 + uVar5 * 4));
    }
    break;
  case 'l':
    uVar6 = (ulong)((long)(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar2) >> 3;
    StreamWriter<false,_false>::Put<unsigned_int>(s,(uint)uVar6);
    StreamWriter<false,_false>::Put<unsigned_int>(s,0);
    StreamWriter<false,_false>::Put<unsigned_int>
              (s,*(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      StreamWriter<false,_false>::Put<long>(s,(long)pdVar2[uVar5]);
    }
    break;
  default:
    if (cVar1 == 'Y') {
      StreamWriter<false,_false>::Put<short>(s,*(short *)pdVar2);
      return;
    }
  case 'e':
  case 'g':
  case 'h':
  case 'j':
  case 'k':
switchD_0035793e_caseD_45:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
    std::operator<<((ostream *)&err,"Tried to dump property with invalid type \'");
    poVar4 = std::operator<<((ostream *)&err,this->type);
    std::operator<<(poVar4,"\'!");
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    DeadlyImportError::DeadlyImportError(this_00,&sStack_1c8);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void FBXExportProperty::DumpBinary(Assimp::StreamWriterLE& s) {
    s.PutU1(type);
    uint8_t* d = data.data();
    size_t N;
    switch (type) {
        case 'C': s.PutU1(*(reinterpret_cast<uint8_t*>(d))); return;
        case 'Y': s.PutI2(*(reinterpret_cast<int16_t*>(d))); return;
        case 'I': s.PutI4(*(reinterpret_cast<int32_t*>(d))); return;
        case 'F': s.PutF4(*(reinterpret_cast<float*>(d))); return;
        case 'D': s.PutF8(*(reinterpret_cast<double*>(d))); return;
        case 'L': s.PutI8(*(reinterpret_cast<int64_t*>(d))); return;
        case 'S':
        case 'R':
            s.PutU4(uint32_t(data.size()));
            for (size_t i = 0; i < data.size(); ++i) { s.PutU1(data[i]); }
            return;
        case 'i':
            N = data.size() / 4;
            s.PutU4(uint32_t(N)); // number of elements
            s.PutU4(0); // no encoding (1 would be zip-compressed)
            // TODO: compress if large?
            s.PutU4(uint32_t(data.size())); // data size
            for (size_t i = 0; i < N; ++i) {
                s.PutI4((reinterpret_cast<int32_t*>(d))[i]);
            }
            return;
        case 'l':
            N = data.size() / 8;
            s.PutU4(uint32_t(N)); // number of elements
            s.PutU4(0); // no encoding (1 would be zip-compressed)
            // TODO: compress if large?
            s.PutU4(uint32_t(data.size())); // data size
            for (size_t i = 0; i < N; ++i) {
                s.PutI8((reinterpret_cast<int64_t*>(d))[i]);
            }
            return;
        case 'f':
            N = data.size() / 4;
            s.PutU4(uint32_t(N)); // number of elements
            s.PutU4(0); // no encoding (1 would be zip-compressed)
            // TODO: compress if large?
            s.PutU4(uint32_t(data.size())); // data size
            for (size_t i = 0; i < N; ++i) {
                s.PutF4((reinterpret_cast<float*>(d))[i]);
            }
            return;
        case 'd':
            N = data.size() / 8;
            s.PutU4(uint32_t(N)); // number of elements
            s.PutU4(0); // no encoding (1 would be zip-compressed)
            // TODO: compress if large?
            s.PutU4(uint32_t(data.size())); // data size
            for (size_t i = 0; i < N; ++i) {
                s.PutF8((reinterpret_cast<double*>(d))[i]);
            }
            return;
        default:
            std::ostringstream err;
            err << "Tried to dump property with invalid type '";
            err << type << "'!";
            throw DeadlyExportError(err.str());
    }
}